

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O3

void Ssw_SmlReinitialize(Ssw_Sml_t *p)

{
  Aig_Man_t *pAVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  
  pAVar1 = p->pAig;
  if (pAVar1->nRegs < 1) {
    __assert_fail("Aig_ManRegNum(p->pAig) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswSim.c"
                  ,0x3bf,"void Ssw_SmlReinitialize(Ssw_Sml_t *)");
  }
  if (pAVar1->nObjs[2] <= pAVar1->nRegs) {
    __assert_fail("Aig_ManRegNum(p->pAig) < Aig_ManCiNum(p->pAig)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswSim.c"
                  ,0x3c0,"void Ssw_SmlReinitialize(Ssw_Sml_t *)");
  }
  if (0 < pAVar1->nTruePis) {
    lVar5 = 0;
    do {
      if (pAVar1->vCis->nSize <= lVar5) goto LAB_006b3051;
      Ssw_SmlAssignRandom(p,(Aig_Obj_t *)pAVar1->vCis->pArray[lVar5]);
      lVar5 = lVar5 + 1;
      pAVar1 = p->pAig;
    } while (lVar5 < pAVar1->nTruePis);
    if (pAVar1->nRegs < 1) {
      return;
    }
  }
  iVar3 = 0;
  while ((((uVar2 = pAVar1->nTruePos + iVar3, -1 < (int)uVar2 && ((int)uVar2 < pAVar1->vCos->nSize))
          && (uVar4 = pAVar1->nTruePis + iVar3, -1 < (int)uVar4)) &&
         ((int)uVar4 < pAVar1->vCis->nSize))) {
    Ssw_SmlNodeTransferFirst
              (p,(Aig_Obj_t *)pAVar1->vCos->pArray[uVar2],(Aig_Obj_t *)pAVar1->vCis->pArray[uVar4]);
    iVar3 = iVar3 + 1;
    pAVar1 = p->pAig;
    if (pAVar1->nRegs <= iVar3) {
      return;
    }
  }
LAB_006b3051:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

void Ssw_SmlReinitialize( Ssw_Sml_t * p )
{
    Aig_Obj_t * pObj, * pObjLi, * pObjLo;
    int i;
    assert( Aig_ManRegNum(p->pAig) > 0 );
    assert( Aig_ManRegNum(p->pAig) < Aig_ManCiNum(p->pAig) );
    // assign random info for primary inputs
    Saig_ManForEachPi( p->pAig, pObj, i )
        Ssw_SmlAssignRandom( p, pObj );
    // copy simulation info into the inputs
    Saig_ManForEachLiLo( p->pAig, pObjLi, pObjLo, i )
        Ssw_SmlNodeTransferFirst( p, pObjLi, pObjLo );
}